

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapValues.cpp
# Opt level: O0

void TTD::NSSnapValues::ParsePromiseCapabilityInfo
               (SnapPromiseCapabilityInfo *capabilityInfo,bool readSeparator,FileReader *reader,
               SlabAllocator *alloc)

{
  TTD_PTR_ID TVar1;
  TTDVar pvVar2;
  FileReader *reader_00;
  FileReader *reader_01;
  FileReader *reader_02;
  bool readSeparator_00;
  undefined8 in_R8;
  undefined8 in_R9;
  SlabAllocator *alloc_local;
  FileReader *reader_local;
  bool readSeparator_local;
  SnapPromiseCapabilityInfo *capabilityInfo_local;
  
  (*reader->_vptr_FileReader[6])
            (reader,(ulong)readSeparator & 1,reader,
             CONCAT71((int7)((ulong)alloc >> 8),readSeparator) & 0xffffffffffffff01,in_R8,in_R9,
             alloc);
  TVar1 = FileReader::ReadAddr(reader,ptrIdVal,false);
  capabilityInfo->CapabilityId = TVar1;
  (*reader->_vptr_FileReader[3])(reader,3,1);
  readSeparator_00 = SUB81(reader,0);
  pvVar2 = ParseTTDVar((NSSnapValues *)0x0,readSeparator_00,reader_00);
  capabilityInfo->PromiseVar = pvVar2;
  (*reader->_vptr_FileReader[3])(reader,3,1);
  pvVar2 = ParseTTDVar((NSSnapValues *)0x0,readSeparator_00,reader_01);
  capabilityInfo->ResolveVar = pvVar2;
  (*reader->_vptr_FileReader[3])(reader,3,1);
  pvVar2 = ParseTTDVar((NSSnapValues *)0x0,readSeparator_00,reader_02);
  capabilityInfo->RejectVar = pvVar2;
  (*reader->_vptr_FileReader[7])();
  return;
}

Assistant:

void ParsePromiseCapabilityInfo(SnapPromiseCapabilityInfo* capabilityInfo, bool readSeparator, FileReader* reader, SlabAllocator& alloc)
        {
            reader->ReadRecordStart(readSeparator);

            capabilityInfo->CapabilityId = reader->ReadAddr(NSTokens::Key::ptrIdVal);

            reader->ReadKey(NSTokens::Key::entry, true);
            capabilityInfo->PromiseVar = ParseTTDVar(false, reader);

            reader->ReadKey(NSTokens::Key::entry, true);
            capabilityInfo->ResolveVar = ParseTTDVar(false, reader);

            reader->ReadKey(NSTokens::Key::entry, true);
            capabilityInfo->RejectVar = ParseTTDVar(false, reader);

            reader->ReadRecordEnd();
        }